

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O1

void __thiscall cmXMLWriter::ProcessingInstruction(cmXMLWriter *this,char *target,char *data)

{
  size_t sVar1;
  ostream *poVar2;
  char local_19;
  
  CloseStartElement(this);
  ConditionalLineBreak(this,(bool)(this->IsContent ^ 1));
  poVar2 = this->Output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<?",2);
  if (target == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(target);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,target,sVar1);
  }
  local_19 = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_19,1);
  if (data == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)poVar2->_vptr_basic_ostream[-3]);
  }
  else {
    sVar1 = strlen(data);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,data,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"?>",2);
  return;
}

Assistant:

void cmXMLWriter::ProcessingInstruction(const char* target, const char* data)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent);
  this->Output << "<?" << target << ' ' << data << "?>";
}